

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O1

vector<double,_std::allocator<double>_> *
calc_kurtosis_all_data<InputData<float,int>,double>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          InputData<float,_int> *input_data,ModelParams *model_params,Xoshiro256PP *rnd_generator)

{
  int *Xc_indptr;
  double *pdVar1;
  double *pdVar2;
  float *pfVar3;
  double *buffer_prob;
  ulong uVar4;
  double *pdVar5;
  vector<double,_std::allocator<double>_> *__range1;
  ulong uVar6;
  double dVar7;
  size_t *local_40;
  allocator_type local_31;
  
  if (input_data->ncols_categ == 0) {
    local_40 = (size_t *)0x0;
    buffer_prob = (double *)0x0;
  }
  else {
    uVar4 = 0xffffffffffffffff;
    if (-1 < (long)input_data->max_categ) {
      uVar4 = (long)input_data->max_categ * 8;
    }
    buffer_prob = (double *)operator_new__(uVar4);
    if ((input_data->sample_weights == (float *)0x0) || (input_data->weight_as_sample == true)) {
      uVar4 = 0xffffffffffffffff;
      if (-2 < (long)input_data->max_categ) {
        uVar4 = (long)input_data->max_categ * 8 + 8;
      }
      local_40 = (size_t *)operator_new__(uVar4);
    }
    else {
      local_40 = (size_t *)0x0;
    }
  }
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,input_data->ncols_categ + input_data->ncols_numeric,&local_31);
  uVar4 = input_data->ncols_tot;
  if (uVar4 != 0) {
    uVar6 = 0;
    do {
      uVar4 = input_data->ncols_numeric;
      if (uVar6 < uVar4) {
        Xc_indptr = input_data->Xc_indptr;
        if (Xc_indptr == (int *)0x0) {
          if ((input_data->sample_weights == (float *)0x0) || (input_data->weight_as_sample == true)
             ) {
            dVar7 = calc_kurtosis<float,double>
                              (input_data->numeric_data + input_data->nrows * uVar6,
                               input_data->nrows,model_params->missing_action);
          }
          else {
            dVar7 = calc_kurtosis_weighted<float,double>
                              (input_data->numeric_data + input_data->nrows * uVar6,
                               input_data->nrows,model_params->missing_action,
                               input_data->sample_weights);
          }
        }
        else if ((input_data->sample_weights == (float *)0x0) ||
                (input_data->weight_as_sample == true)) {
          dVar7 = calc_kurtosis<float,int,double>
                            (uVar6,input_data->nrows,input_data->Xc,input_data->Xc_ind,Xc_indptr,
                             model_params->missing_action);
        }
        else {
          dVar7 = calc_kurtosis_weighted<float,int,double>
                            (uVar6,input_data->nrows,input_data->Xc,input_data->Xc_ind,Xc_indptr,
                             model_params->missing_action,input_data->sample_weights);
        }
      }
      else if ((input_data->sample_weights == (float *)0x0) ||
              (input_data->weight_as_sample == true)) {
        dVar7 = calc_kurtosis<double>
                          (input_data->nrows,
                           input_data->categ_data + (uVar6 - uVar4) * input_data->nrows,
                           input_data->ncat[uVar6 - uVar4],local_40,buffer_prob,
                           model_params->missing_action,model_params->cat_split_type,rnd_generator);
      }
      else {
        dVar7 = calc_kurtosis_weighted<float,double>
                          (input_data->nrows,
                           input_data->categ_data + (uVar6 - uVar4) * input_data->nrows,
                           input_data->ncat[uVar6 - uVar4],buffer_prob,model_params->missing_action,
                           model_params->cat_split_type,rnd_generator,input_data->sample_weights);
      }
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar6] = dVar7;
      uVar6 = uVar6 + 1;
      uVar4 = input_data->ncols_tot;
    } while (uVar6 < uVar4);
  }
  pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar5 = pdVar1; pdVar5 != pdVar2; pdVar5 = pdVar5 + 1) {
    dVar7 = 0.0;
    if ((-INFINITY < *pdVar5) && (dVar7 = *pdVar5 + -1.0, dVar7 <= 1e-08)) {
      dVar7 = 1e-08;
    }
    *pdVar5 = dVar7;
  }
  pfVar3 = input_data->col_weights;
  if (uVar4 != 0 && pfVar3 != (float *)0x0) {
    uVar6 = 0;
    do {
      if (0.0 < pdVar1[uVar6]) {
        dVar7 = pdVar1[uVar6] * (double)pfVar3[uVar6];
        if (dVar7 <= 1e-100) {
          dVar7 = 1e-100;
        }
        pdVar1[uVar6] = dVar7;
      }
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (local_40 != (size_t *)0x0) {
    operator_delete__(local_40);
  }
  if (buffer_prob != (double *)0x0) {
    operator_delete__(buffer_prob);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> calc_kurtosis_all_data(InputData &input_data, ModelParams &model_params, RNG_engine &rnd_generator)
{
    std::unique_ptr<double[]> buffer_double;
    std::unique_ptr<size_t[]> buffer_size_t;
    if (input_data.ncols_categ)
    {
        buffer_double = std::unique_ptr<double[]>(new double[input_data.max_categ]);
        if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
            buffer_size_t = std::unique_ptr<size_t[]>(new size_t[input_data.max_categ + 1]);
    }


    std::vector<double> kurt_weights(input_data.ncols_numeric + input_data.ncols_categ);
    for (size_t col = 0; col < input_data.ncols_tot; col++)
    {
        if (col < input_data.ncols_numeric)
        {
            if (input_data.Xc_indptr == NULL)
            {
                if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
                {
                    kurt_weights[col]
                        = calc_kurtosis<typename std::remove_pointer<decltype(input_data.numeric_data)>::type, ldouble_safe>(
                                        input_data.numeric_data + col * input_data.nrows,
                                        input_data.nrows, model_params.missing_action);
                }

                else
                {
                    kurt_weights[col]
                        = calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                                 ldouble_safe>(
                                                 input_data.numeric_data + col * input_data.nrows, input_data.nrows,
                                                 model_params.missing_action, input_data.sample_weights);
                }
            }

            else
            {
                if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
                {
                    kurt_weights[col]
                        = calc_kurtosis<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                        typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                        ldouble_safe>(
                                        col, input_data.nrows,
                                        input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                        model_params.missing_action);
                }

                else
                {
                    kurt_weights[col]
                        = calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                                 typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                                 ldouble_safe>(
                                                 col, input_data.nrows,
                                                 input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                                 model_params.missing_action, input_data.sample_weights);
                }
            }
        }

        else
        {
            if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
            {
                kurt_weights[col]
                        = calc_kurtosis<ldouble_safe>(input_data.nrows,
                                        input_data.categ_data + (col- input_data.ncols_numeric) * input_data.nrows,
                                        input_data.ncat[col - input_data.ncols_numeric],
                                        buffer_size_t.get(), buffer_double.get(),
                                        model_params.missing_action, model_params.cat_split_type, rnd_generator);
            }

            else
            {
                kurt_weights[col]
                        = calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.sample_weights)>::type,
                                                 ldouble_safe>(
                                                 input_data.nrows,
                                                 input_data.categ_data + (col- input_data.ncols_numeric) * input_data.nrows,
                                                 input_data.ncat[col - input_data.ncols_numeric],
                                                 buffer_double.get(),
                                                 model_params.missing_action, model_params.cat_split_type,
                                                 rnd_generator, input_data.sample_weights);
            }
        }
    }

    for (auto &w : kurt_weights) w = (w == -HUGE_VAL)? 0. : std::fmax(1e-8, -1. + w);
    if (input_data.col_weights != NULL)
    {
        for (size_t col = 0; col < input_data.ncols_tot; col++)
        {
            if (kurt_weights[col] <= 0) continue;
            kurt_weights[col] *= input_data.col_weights[col];
            kurt_weights[col] = std::fmax(kurt_weights[col], 1e-100);
        }
    }

    return kurt_weights;
}